

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::SetColumnOffset(int column_index,float offset)

{
  int iVar1;
  ImGuiColumns *pIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  ImGuiColumnData *pIVar5;
  int iVar6;
  ImGuiColumnData *pIVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  
  do {
    pIVar4 = GImGui;
    pIVar2 = (GImGui->CurrentWindow->DC).CurrentColumns;
    if (pIVar2 == (ImGuiColumns *)0x0) {
      __assert_fail("columns != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                    ,0x1c4b,"void ImGui::SetColumnOffset(int, float)");
    }
    if (column_index < 0) {
      column_index = pIVar2->Current;
    }
    iVar1 = (pIVar2->Columns).Size;
    if (iVar1 <= column_index) {
      __assert_fail("column_index < columns->Columns.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                    ,0x1c4f,"void ImGui::SetColumnOffset(int, float)");
    }
    if ((pIVar2->Flags & 4U) == 0) {
      bVar3 = column_index < pIVar2->Count + -1;
    }
    else {
      bVar3 = false;
    }
    fVar10 = 0.0;
    if (bVar3) {
      iVar6 = column_index;
      if (column_index < 0) {
        iVar6 = pIVar2->Current;
      }
      iVar8 = iVar6 + 1;
      if (pIVar2->IsBeingResized == false) {
        if (iVar1 <= iVar8) goto LAB_002fc619;
        pIVar7 = (pIVar2->Columns).Data;
        pIVar5 = pIVar7 + iVar8;
        pIVar7 = pIVar7 + iVar6;
      }
      else {
        if (iVar1 <= iVar8) {
LAB_002fc619:
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.h"
                        ,0x4de,"T &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]"
                       );
        }
        pIVar7 = (pIVar2->Columns).Data;
        pIVar5 = (ImGuiColumnData *)&pIVar7[iVar8].OffsetNormBeforeResize;
        pIVar7 = (ImGuiColumnData *)&pIVar7[iVar6].OffsetNormBeforeResize;
      }
      fVar10 = (pIVar2->OffMaxX - pIVar2->OffMinX) * (pIVar5->OffsetNorm - pIVar7->OffsetNorm);
    }
    if (((pIVar2->Flags & 8U) == 0) &&
       (fVar11 = pIVar2->OffMaxX -
                 (float)(pIVar2->Count - column_index) * (GImGui->Style).ColumnsMinSpacing,
       fVar11 <= offset)) {
      offset = fVar11;
    }
    (pIVar2->Columns).Data[column_index].OffsetNorm =
         (offset - pIVar2->OffMinX) / (pIVar2->OffMaxX - pIVar2->OffMinX);
    if (!bVar3) {
      return;
    }
    column_index = column_index + 1;
    fVar11 = (pIVar4->Style).ColumnsMinSpacing;
    uVar9 = -(uint)(fVar10 <= fVar11);
    offset = offset + (float)(~uVar9 & (uint)fVar10 | (uint)fVar11 & uVar9);
  } while( true );
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const bool preserve_width = !(columns->Flags & ImGuiColumnsFlags_NoPreserveWidths) && (column_index < columns->Count-1);
    const float width = preserve_width ? GetColumnWidthEx(columns, column_index, columns->IsBeingResized) : 0.0f;

    if (!(columns->Flags & ImGuiColumnsFlags_NoForceWithinWindow))
        offset = ImMin(offset, columns->OffMaxX - g.Style.ColumnsMinSpacing * (columns->Count - column_index));
    columns->Columns[column_index].OffsetNorm = GetColumnNormFromOffset(columns, offset - columns->OffMinX);

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}